

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scoped_ptr.hpp
# Opt level: O2

void __thiscall
asio::detail::scoped_ptr<asio::io_context::work>::reset
          (scoped_ptr<asio::io_context::work> *this,work *p)

{
  work *this_00;
  
  this_00 = this->p_;
  if (this_00 != (work *)0x0) {
    io_context::work::~work(this_00);
  }
  operator_delete(this_00);
  this->p_ = p;
  return;
}

Assistant:

void reset(T* p = 0)
  {
    delete p_;
    p_ = p;
  }